

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

string * __thiscall
CharacterInstance::op_isLessThan
          (CharacterInstance *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  bool bVar1;
  size_type sVar2;
  undefined8 *puVar3;
  char *pcVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  shared_ptr<Instance> *in_stack_00000058;
  shared_ptr<Instance> *in_stack_00000060;
  InstanceIsLessThanComparator *in_stack_00000068;
  string *in_stack_ffffffffffffff68;
  shared_ptr<Instance> *in_stack_ffffffffffffff70;
  allocator *paVar5;
  allocator local_5d [69];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  
  local_18 = in_RDX;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDX);
  if (sVar2 != 1) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "RuntimeError: wrong number of arguments.";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,0);
  bVar1 = Grammar::is_character_value(in_stack_ffffffffffffff68);
  if (!bVar1) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "RuntimeError: invalid argument.";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  std::enable_shared_from_this<Instance>::shared_from_this
            ((enable_shared_from_this<Instance> *)in_stack_ffffffffffffff68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](local_18,0);
  std::make_shared<CharacterInstance,std::__cxx11::string_const&>(in_RSI);
  std::shared_ptr<Instance>::shared_ptr<CharacterInstance,void>
            (in_stack_ffffffffffffff70,(shared_ptr<CharacterInstance> *)in_stack_ffffffffffffff68);
  bVar1 = InstanceIsLessThanComparator::operator()
                    (in_stack_00000068,in_stack_00000060,in_stack_00000058);
  pcVar4 = "false";
  if (bVar1) {
    pcVar4 = "true";
  }
  paVar5 = local_5d;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,pcVar4,paVar5);
  std::allocator<char>::~allocator((allocator<char> *)local_5d);
  std::shared_ptr<Instance>::~shared_ptr((shared_ptr<Instance> *)0x1b5e8d);
  std::shared_ptr<CharacterInstance>::~shared_ptr((shared_ptr<CharacterInstance> *)0x1b5e97);
  std::shared_ptr<Instance>::~shared_ptr((shared_ptr<Instance> *)0x1b5ea1);
  return in_RDI;
}

Assistant:

std::string CharacterInstance::op_isLessThan(const std::vector<std::string>& arguments) {
    if (arguments.size() != 1)
        throw EXC_WRONG_NUMBER_OF_ARGUMENTS;
    if (!Grammar::is_character_value(arguments[0]))
        throw EXC_INVALID_ARGUMENT;
    return InstanceIsLessThanComparator()(shared_from_this(), std::make_shared<CharacterInstance>(arguments[0])) ?
           "true" : "false";
}